

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::ParseBoolFlag(char *str,char *flag,bool *value)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar2 = ParseFlagValue(str,flag,true);
  if (pcVar2 != (char *)0x0) {
    cVar1 = *pcVar2;
    bVar3 = false;
    if ((cVar1 != '0') && (bVar3 = false, cVar1 != 'f')) {
      bVar3 = cVar1 != 'F';
    }
    *value = bVar3;
  }
  return pcVar2 != (char *)0x0;
}

Assistant:

static bool ParseBoolFlag(const char* str, const char* flag, bool* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, true);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Converts the string value to a bool.
  *value = !(*value_str == '0' || *value_str == 'f' || *value_str == 'F');
  return true;
}